

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_metadata.cpp
# Opt level: O2

void __thiscall
duckdb::ParquetMetaDataOperatorData::LoadRowGroupMetadata
          (ParquetMetaDataOperatorData *this,ClientContext *context,
          vector<duckdb::LogicalType,_true> *return_types,OpenFileInfo *file)

{
  ColumnDataCollection *pCVar1;
  duckdb *pdVar2;
  pointer pKVar3;
  FileMetaData *pFVar4;
  const_reference schema;
  const_reference pvVar5;
  const_reference pvVar6;
  reference schema_ele;
  InternalException *this_00;
  pointer pCVar7;
  type *entry;
  type *entry_00;
  type *extraout_RDX;
  type *entry_01;
  type *extraout_RDX_00;
  type *encoding;
  duckdb *this_01;
  pointer pKVar8;
  Value *pVVar9;
  size_type __n;
  pointer pCVar10;
  ulong uVar11;
  LogicalType *type;
  DataChunk current_chunk;
  vector<duckdb::Value,_true> map_values;
  vector<duckdb::Value,_true> map_keys;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  encoding_string;
  vector<duckdb::ParquetColumnSchema,_true> column_schemas;
  ParquetColumnSchema column_schema;
  ParquetOptions local_3b8;
  shared_ptr<duckdb::ParquetFileMetadataCache,_true> local_378;
  LogicalType local_368 [24];
  LogicalType local_350 [24];
  string local_338;
  vector local_318 [32];
  string local_2f8;
  string local_2d8;
  vector local_2b8 [32];
  string local_298 [32];
  OpenFileInfo local_278;
  ParquetOptions local_248;
  ParquetOptions parquet_options;
  ParquetReader reader;
  
  pCVar1 = &this->collection;
  duckdb::ColumnDataCollection::Reset();
  ParquetOptions::ParquetOptions(&parquet_options,context);
  std::__cxx11::string::string((string *)&local_338,(string *)file);
  OpenFileInfo::OpenFileInfo(&local_278,&local_338);
  ParquetOptions::ParquetOptions(&local_248,&parquet_options);
  local_378.internal.
  super___shared_ptr<duckdb::ParquetFileMetadataCache,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_378.internal.
  super___shared_ptr<duckdb::ParquetFileMetadataCache,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ParquetReader::ParquetReader(&reader,context,&local_278,&local_248,&local_378);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_378.internal.
              super___shared_ptr<duckdb::ParquetFileMetadataCache,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  ParquetOptions::~ParquetOptions(&local_248);
  OpenFileInfo::~OpenFileInfo(&local_278);
  std::__cxx11::string::~string((string *)&local_338);
  duckdb::DataChunk::DataChunk(&current_chunk);
  duckdb::DataChunk::Initialize
            ((ClientContext *)&current_chunk,(vector *)context,(ulong)return_types);
  pFVar4 = ParquetReader::GetFileMetadata(&reader);
  column_schemas.
  super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
  super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  column_schemas.
  super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
  super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  column_schemas.
  super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
  super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  for (uVar11 = 0;
      uVar11 < (ulong)(((long)(pFVar4->schema).
                              super_vector<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>
                              .
                              super__Vector_base<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(pFVar4->schema).
                             super_vector<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>
                             .
                             super__Vector_base<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>
                             ._M_impl.super__Vector_impl_data._M_start) / 0x148);
      uVar11 = uVar11 + 1) {
    schema = vector<duckdb_parquet::SchemaElement,_true>::get<true>(&pFVar4->schema,uVar11);
    if (schema->num_children < 1) {
      ParquetColumnSchema::ParquetColumnSchema(&column_schema);
      ParquetReader::DeriveLogicalType
                ((ParquetReader *)&map_keys,(SchemaElement *)&reader,(ParquetColumnSchema *)schema);
      LogicalType::operator=(&column_schema.type,(LogicalType *)&map_keys);
      duckdb::LogicalType::~LogicalType((LogicalType *)&map_keys);
      std::vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>::
      emplace_back<duckdb::ParquetColumnSchema>
                (&column_schemas.
                  super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
                 ,&column_schema);
      ParquetColumnSchema::~ParquetColumnSchema(&column_schema);
    }
  }
  __n = 0;
  pVVar9 = (Value *)0x0;
  while( true ) {
    if ((ulong)(((long)(pFVar4->row_groups).
                       super_vector<duckdb_parquet::RowGroup,_std::allocator<duckdb_parquet::RowGroup>_>
                       .
                       super__Vector_base<duckdb_parquet::RowGroup,_std::allocator<duckdb_parquet::RowGroup>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)(pFVar4->row_groups).
                      super_vector<duckdb_parquet::RowGroup,_std::allocator<duckdb_parquet::RowGroup>_>
                      .
                      super__Vector_base<duckdb_parquet::RowGroup,_std::allocator<duckdb_parquet::RowGroup>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x60) <= __n) {
      duckdb::ColumnDataCollection::Append((DataChunk *)pCVar1);
      duckdb::ColumnDataCollection::InitializeScan((ColumnDataScanState *)pCVar1,(char)this + 0x78);
      std::vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>::
      ~vector(&column_schemas.
               super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
             );
      duckdb::DataChunk::~DataChunk(&current_chunk);
      ParquetReader::~ParquetReader(&reader);
      ParquetOptions::~ParquetOptions(&parquet_options);
      return;
    }
    pvVar5 = vector<duckdb_parquet::RowGroup,_true>::get<true>(&pFVar4->row_groups,__n);
    pCVar10 = (pvVar5->columns).
              super_vector<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>
              .
              super__Vector_base<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pCVar7 = (pvVar5->columns).
             super_vector<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>
             .
             super__Vector_base<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    uVar11 = ((long)pCVar7 - (long)pCVar10) / 0x280;
    if ((ulong)(((long)column_schemas.
                       super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
                       .
                       super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)column_schemas.
                      super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
                      .
                      super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x90) < uVar11) break;
    for (uVar11 = 0; uVar11 < (ulong)(((long)pCVar7 - (long)pCVar10) / 0x280); uVar11 = uVar11 + 1)
    {
      pvVar6 = vector<duckdb_parquet::ColumnChunk,_true>::get<true>(&pvVar5->columns,uVar11);
      schema_ele = vector<duckdb::ParquetColumnSchema,_true>::get<true>(&column_schemas,uVar11);
      std::__cxx11::string::string(local_298,(string *)file);
      duckdb::Value::Value((Value *)&column_schema);
      duckdb::DataChunk::SetValue((ulong)&current_chunk,0,pVVar9);
      duckdb::Value::~Value((Value *)&column_schema);
      std::__cxx11::string::~string(local_298);
      duckdb::Value::BIGINT((long)&column_schema);
      duckdb::DataChunk::SetValue((ulong)&current_chunk,1,pVVar9);
      duckdb::Value::~Value((Value *)&column_schema);
      duckdb::Value::BIGINT((long)&column_schema);
      duckdb::DataChunk::SetValue((ulong)&current_chunk,2,pVVar9);
      duckdb::Value::~Value((Value *)&column_schema);
      duckdb::Value::BIGINT((long)&column_schema);
      duckdb::DataChunk::SetValue((ulong)&current_chunk,3,pVVar9);
      duckdb::Value::~Value((Value *)&column_schema);
      duckdb::Value::BIGINT((long)&column_schema);
      duckdb::DataChunk::SetValue((ulong)&current_chunk,4,pVVar9);
      duckdb::Value::~Value((Value *)&column_schema);
      duckdb::Value::BIGINT((long)&column_schema);
      duckdb::DataChunk::SetValue((ulong)&current_chunk,5,pVVar9);
      duckdb::Value::~Value((Value *)&column_schema);
      ParquetElementBigint<long_const&>
                ((duckdb *)&column_schema,&pvVar6->file_offset,
                 (bool)(((byte)pvVar5->__isset & 2) >> 1));
      duckdb::DataChunk::SetValue((ulong)&current_chunk,6,pVVar9);
      duckdb::Value::~Value((Value *)&column_schema);
      duckdb::Value::BIGINT((long)&column_schema);
      duckdb::DataChunk::SetValue((ulong)&current_chunk,7,pVVar9);
      duckdb::Value::~Value((Value *)&column_schema);
      std::__cxx11::string::string((string *)&map_keys,", ",(allocator *)&encoding_string);
      duckdb::StringUtil::Join(local_2b8,(string *)&(pvVar6->meta_data).path_in_schema);
      duckdb::Value::Value((Value *)&column_schema,local_2b8);
      duckdb::DataChunk::SetValue((ulong)&current_chunk,8,pVVar9);
      duckdb::Value::~Value((Value *)&column_schema);
      std::__cxx11::string::~string((string *)local_2b8);
      std::__cxx11::string::~string((string *)&map_keys);
      ConvertParquetElementToString<duckdb_parquet::Type::type_const&>
                (&local_2d8,(duckdb *)&(pvVar6->meta_data).type,entry);
      duckdb::Value::Value((Value *)&column_schema,&local_2d8);
      duckdb::DataChunk::SetValue((ulong)&current_chunk,9,pVVar9);
      type = &schema_ele->type;
      duckdb::Value::~Value((Value *)&column_schema);
      std::__cxx11::string::~string((string *)&local_2d8);
      ConvertParquetStats((duckdb *)&column_schema,type,schema_ele,
                          (bool)(((byte)(pvVar6->meta_data).statistics.__isset & 2) >> 1),
                          &(pvVar6->meta_data).statistics.min);
      duckdb::DataChunk::SetValue((ulong)&current_chunk,10,pVVar9);
      duckdb::Value::~Value((Value *)&column_schema);
      ConvertParquetStats((duckdb *)&column_schema,type,schema_ele,
                          (bool)((byte)(pvVar6->meta_data).statistics.__isset & 1),
                          &(pvVar6->meta_data).statistics.max);
      duckdb::DataChunk::SetValue((ulong)&current_chunk,0xb,pVVar9);
      duckdb::Value::~Value((Value *)&column_schema);
      ParquetElementBigint<long_const&>
                ((duckdb *)&column_schema,&(pvVar6->meta_data).statistics.null_count,
                 (bool)(((byte)(pvVar6->meta_data).statistics.__isset & 4) >> 2));
      duckdb::DataChunk::SetValue((ulong)&current_chunk,0xc,pVVar9);
      duckdb::Value::~Value((Value *)&column_schema);
      ParquetElementBigint<long_const&>
                ((duckdb *)&column_schema,&(pvVar6->meta_data).statistics.distinct_count,
                 (bool)(((byte)(pvVar6->meta_data).statistics.__isset & 8) >> 3));
      duckdb::DataChunk::SetValue((ulong)&current_chunk,0xd,pVVar9);
      duckdb::Value::~Value((Value *)&column_schema);
      ConvertParquetStats((duckdb *)&column_schema,type,schema_ele,
                          (bool)(((byte)(pvVar6->meta_data).statistics.__isset & 0x20) >> 5),
                          &(pvVar6->meta_data).statistics.min_value);
      duckdb::DataChunk::SetValue((ulong)&current_chunk,0xe,pVVar9);
      duckdb::Value::~Value((Value *)&column_schema);
      ConvertParquetStats((duckdb *)&column_schema,type,schema_ele,
                          (bool)(((byte)(pvVar6->meta_data).statistics.__isset & 0x10) >> 4),
                          &(pvVar6->meta_data).statistics.max_value);
      duckdb::DataChunk::SetValue((ulong)&current_chunk,0xf,pVVar9);
      duckdb::Value::~Value((Value *)&column_schema);
      ConvertParquetElementToString<duckdb_parquet::CompressionCodec::type_const&>
                (&local_2f8,(duckdb *)&(pvVar6->meta_data).codec,entry_00);
      duckdb::Value::Value((Value *)&column_schema,&local_2f8);
      duckdb::DataChunk::SetValue((ulong)&current_chunk,0x10,pVVar9);
      duckdb::Value::~Value((Value *)&column_schema);
      std::__cxx11::string::~string((string *)&local_2f8);
      encoding_string.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      encoding_string.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      encoding_string.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::reserve(&encoding_string.
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ,(long)(pvVar6->meta_data).encodings.
                       super_vector<duckdb_parquet::Encoding::type,_std::allocator<duckdb_parquet::Encoding::type>_>
                       .
                       super__Vector_base<duckdb_parquet::Encoding::type,_std::allocator<duckdb_parquet::Encoding::type>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(pvVar6->meta_data).encodings.
                       super_vector<duckdb_parquet::Encoding::type,_std::allocator<duckdb_parquet::Encoding::type>_>
                       .
                       super__Vector_base<duckdb_parquet::Encoding::type,_std::allocator<duckdb_parquet::Encoding::type>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 2);
      pdVar2 = (duckdb *)
               (pvVar6->meta_data).encodings.
               super_vector<duckdb_parquet::Encoding::type,_std::allocator<duckdb_parquet::Encoding::type>_>
               .
               super__Vector_base<duckdb_parquet::Encoding::type,_std::allocator<duckdb_parquet::Encoding::type>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      entry_01 = extraout_RDX;
      for (this_01 = (duckdb *)
                     (pvVar6->meta_data).encodings.
                     super_vector<duckdb_parquet::Encoding::type,_std::allocator<duckdb_parquet::Encoding::type>_>
                     .
                     super__Vector_base<duckdb_parquet::Encoding::type,_std::allocator<duckdb_parquet::Encoding::type>_>
                     ._M_impl.super__Vector_impl_data._M_start; this_01 != pdVar2;
          this_01 = this_01 + 4) {
        ConvertParquetElementToString<duckdb_parquet::Encoding::type_const&>
                  ((string *)&column_schema,this_01,entry_01);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &encoding_string,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &column_schema);
        std::__cxx11::string::~string((string *)&column_schema);
        entry_01 = extraout_RDX_00;
      }
      std::__cxx11::string::string((string *)&map_keys,", ",(allocator *)&map_values);
      duckdb::StringUtil::Join(local_318,(string *)&encoding_string);
      duckdb::Value::Value((Value *)&column_schema,local_318);
      duckdb::DataChunk::SetValue((ulong)&current_chunk,0x11,pVVar9);
      duckdb::Value::~Value((Value *)&column_schema);
      std::__cxx11::string::~string((string *)local_318);
      std::__cxx11::string::~string((string *)&map_keys);
      ParquetElementBigint<long_const&>
                ((duckdb *)&column_schema,&(pvVar6->meta_data).index_page_offset,
                 (bool)(((byte)(pvVar6->meta_data).__isset & 2) >> 1));
      duckdb::DataChunk::SetValue((ulong)&current_chunk,0x12,pVVar9);
      duckdb::Value::~Value((Value *)&column_schema);
      ParquetElementBigint<long_const&>
                ((duckdb *)&column_schema,&(pvVar6->meta_data).dictionary_page_offset,
                 (bool)(((byte)(pvVar6->meta_data).__isset & 4) >> 2));
      duckdb::DataChunk::SetValue((ulong)&current_chunk,0x13,pVVar9);
      duckdb::Value::~Value((Value *)&column_schema);
      duckdb::Value::BIGINT((long)&column_schema);
      duckdb::DataChunk::SetValue((ulong)&current_chunk,0x14,pVVar9);
      duckdb::Value::~Value((Value *)&column_schema);
      duckdb::Value::BIGINT((long)&column_schema);
      duckdb::DataChunk::SetValue((ulong)&current_chunk,0x15,pVVar9);
      duckdb::Value::~Value((Value *)&column_schema);
      duckdb::Value::BIGINT((long)&column_schema);
      duckdb::DataChunk::SetValue((ulong)&current_chunk,0x16,pVVar9);
      duckdb::Value::~Value((Value *)&column_schema);
      map_keys.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      map_values.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      map_keys.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      map_keys.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      map_values.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      map_values.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      pKVar3 = (pvVar6->meta_data).key_value_metadata.
               super_vector<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>.
               super__Vector_base<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pKVar8 = (pvVar6->meta_data).key_value_metadata.
                    super_vector<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>
                    .
                    super__Vector_base<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>
                    ._M_impl.super__Vector_impl_data._M_start; pKVar8 != pKVar3; pKVar8 = pKVar8 + 1
          ) {
        Value::BLOB_RAW((Value *)&column_schema,&pKVar8->key);
        std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::emplace_back<duckdb::Value>
                  ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&map_keys,
                   (Value *)&column_schema);
        duckdb::Value::~Value((Value *)&column_schema);
        Value::BLOB_RAW((Value *)&column_schema,&pKVar8->value);
        std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::emplace_back<duckdb::Value>
                  (&map_values.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>,
                   (Value *)&column_schema);
        duckdb::Value::~Value((Value *)&column_schema);
      }
      duckdb::LogicalType::LogicalType(local_368,BLOB);
      duckdb::LogicalType::LogicalType(local_350,BLOB);
      local_3b8.schema.
      super_vector<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>
      .
      super__Vector_base<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)map_keys.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
                    super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                    super__Vector_impl_data._M_start;
      local_3b8.schema.
      super_vector<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>
      .
      super__Vector_base<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (pointer)map_keys.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
                    super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                    super__Vector_impl_data._M_finish;
      local_3b8.schema.
      super_vector<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>
      .
      super__Vector_base<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)map_keys.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
                    super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
      map_keys.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      map_keys.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      map_keys.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_3b8.binary_as_string =
           map_values.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
           super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
           super__Vector_impl_data._M_start._0_1_;
      local_3b8.file_row_number =
           map_values.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
           super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
           super__Vector_impl_data._M_start._1_1_;
      local_3b8._2_2_ =
           map_values.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
           super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
           super__Vector_impl_data._M_start._2_2_;
      local_3b8._4_4_ =
           map_values.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
           super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
           super__Vector_impl_data._M_start._4_4_;
      local_3b8.encryption_config.internal.
      super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ =
           map_values.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
           super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
           super__Vector_impl_data._M_finish._0_4_;
      local_3b8.encryption_config.internal.
      super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
           map_values.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
           super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
           super__Vector_impl_data._M_finish._4_4_;
      local_3b8.encryption_config.internal.
      super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              map_values.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
              super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
      map_values.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      map_values.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      map_values.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      duckdb::Value::MAP(&column_schema,local_368,local_350,&local_3b8.schema,&local_3b8);
      duckdb::DataChunk::SetValue((ulong)&current_chunk,0x17,pVVar9);
      duckdb::Value::~Value((Value *)&column_schema);
      std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_3b8);
      std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_3b8.schema);
      duckdb::LogicalType::~LogicalType(local_350);
      duckdb::LogicalType::~LogicalType(local_368);
      ParquetElementBigint<long_const&>
                ((duckdb *)&column_schema,&(pvVar6->meta_data).bloom_filter_offset,
                 (bool)(((byte)(pvVar6->meta_data).__isset & 0x20) >> 5));
      duckdb::DataChunk::SetValue((ulong)&current_chunk,0x18,pVVar9);
      duckdb::Value::~Value((Value *)&column_schema);
      ParquetElementBigint<int_const&>
                ((duckdb *)&column_schema,&(pvVar6->meta_data).bloom_filter_length,
                 (bool)(((byte)(pvVar6->meta_data).__isset & 0x40) >> 6));
      duckdb::DataChunk::SetValue((ulong)&current_chunk,0x19,pVVar9);
      duckdb::Value::~Value((Value *)&column_schema);
      ParquetElementBoolean
                ((duckdb *)&column_schema,(pvVar6->meta_data).statistics.is_min_value_exact,
                 (bool)((byte)(pvVar6->meta_data).statistics.__isset >> 7));
      duckdb::DataChunk::SetValue((ulong)&current_chunk,0x1a,pVVar9);
      duckdb::Value::~Value((Value *)&column_schema);
      ParquetElementBoolean
                ((duckdb *)&column_schema,(pvVar6->meta_data).statistics.is_max_value_exact,
                 (bool)(((byte)(pvVar6->meta_data).statistics.__isset & 0x40) >> 6));
      duckdb::DataChunk::SetValue((ulong)&current_chunk,0x1b,pVVar9);
      duckdb::Value::~Value((Value *)&column_schema);
      pVVar9 = pVVar9 + 1;
      if ((Value *)0x7ff < pVVar9) {
        duckdb::ColumnDataCollection::Append((DataChunk *)pCVar1);
        duckdb::DataChunk::Reset();
        pVVar9 = (Value *)0x0;
      }
      std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                (&map_values.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>);
      std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&map_keys);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&encoding_string.
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               );
      pCVar10 = (pvVar5->columns).
                super_vector<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>
                .
                super__Vector_base<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pCVar7 = (pvVar5->columns).
               super_vector<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>
               .
               super__Vector_base<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    }
    __n = __n + 1;
  }
  this_00 = (InternalException *)
            __cxa_allocate_exception
                      (0x10,uVar11,
                       ((long)column_schemas.
                              super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
                              .
                              super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)column_schemas.
                             super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
                             .
                             super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
                             ._M_impl.super__Vector_impl_data._M_start) % 0x90);
  std::__cxx11::string::string
            ((string *)&column_schema,"Too many column in row group: corrupt file?",
             (allocator *)&map_keys);
  duckdb::InternalException::InternalException(this_00,(string *)&column_schema);
  __cxa_throw(this_00,&InternalException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void ParquetMetaDataOperatorData::LoadRowGroupMetadata(ClientContext &context, const vector<LogicalType> &return_types,
                                                       const OpenFileInfo &file) {
	collection.Reset();
	ParquetOptions parquet_options(context);
	ParquetReader reader(context, file.path, parquet_options);
	idx_t count = 0;
	DataChunk current_chunk;
	current_chunk.Initialize(context, return_types);
	auto meta_data = reader.GetFileMetadata();
	vector<ParquetColumnSchema> column_schemas;
	for (idx_t schema_idx = 0; schema_idx < meta_data->schema.size(); schema_idx++) {
		auto &schema_element = meta_data->schema[schema_idx];
		if (schema_element.num_children > 0) {
			continue;
		}
		ParquetColumnSchema column_schema;
		column_schema.type = reader.DeriveLogicalType(schema_element, column_schema);
		column_schemas.push_back(std::move(column_schema));
	}

	for (idx_t row_group_idx = 0; row_group_idx < meta_data->row_groups.size(); row_group_idx++) {
		auto &row_group = meta_data->row_groups[row_group_idx];

		if (row_group.columns.size() > column_schemas.size()) {
			throw InternalException("Too many column in row group: corrupt file?");
		}
		for (idx_t col_idx = 0; col_idx < row_group.columns.size(); col_idx++) {
			auto &column = row_group.columns[col_idx];
			auto &column_schema = column_schemas[col_idx];
			auto &col_meta = column.meta_data;
			auto &stats = col_meta.statistics;
			auto &column_type = column_schema.type;

			// file_name, LogicalType::VARCHAR
			current_chunk.SetValue(0, count, file.path);

			// row_group_id, LogicalType::BIGINT
			current_chunk.SetValue(1, count, Value::BIGINT(UnsafeNumericCast<int64_t>(row_group_idx)));

			// row_group_num_rows, LogicalType::BIGINT
			current_chunk.SetValue(2, count, Value::BIGINT(row_group.num_rows));

			// row_group_num_columns, LogicalType::BIGINT
			current_chunk.SetValue(3, count, Value::BIGINT(UnsafeNumericCast<int64_t>(row_group.columns.size())));

			// row_group_bytes, LogicalType::BIGINT
			current_chunk.SetValue(4, count, Value::BIGINT(row_group.total_byte_size));

			// column_id, LogicalType::BIGINT
			current_chunk.SetValue(5, count, Value::BIGINT(UnsafeNumericCast<int64_t>(col_idx)));

			// file_offset, LogicalType::BIGINT
			current_chunk.SetValue(6, count, ParquetElementBigint(column.file_offset, row_group.__isset.file_offset));

			// num_values, LogicalType::BIGINT
			current_chunk.SetValue(7, count, Value::BIGINT(col_meta.num_values));

			// path_in_schema, LogicalType::VARCHAR
			current_chunk.SetValue(8, count, StringUtil::Join(col_meta.path_in_schema, ", "));

			// type, LogicalType::VARCHAR
			current_chunk.SetValue(9, count, ConvertParquetElementToString(col_meta.type));

			// stats_min, LogicalType::VARCHAR
			current_chunk.SetValue(10, count,
			                       ConvertParquetStats(column_type, column_schema, stats.__isset.min, stats.min));

			// stats_max, LogicalType::VARCHAR
			current_chunk.SetValue(11, count,
			                       ConvertParquetStats(column_type, column_schema, stats.__isset.max, stats.max));

			// stats_null_count, LogicalType::BIGINT
			current_chunk.SetValue(12, count, ParquetElementBigint(stats.null_count, stats.__isset.null_count));

			// stats_distinct_count, LogicalType::BIGINT
			current_chunk.SetValue(13, count, ParquetElementBigint(stats.distinct_count, stats.__isset.distinct_count));

			// stats_min_value, LogicalType::VARCHAR
			current_chunk.SetValue(
			    14, count, ConvertParquetStats(column_type, column_schema, stats.__isset.min_value, stats.min_value));

			// stats_max_value, LogicalType::VARCHAR
			current_chunk.SetValue(
			    15, count, ConvertParquetStats(column_type, column_schema, stats.__isset.max_value, stats.max_value));

			// compression, LogicalType::VARCHAR
			current_chunk.SetValue(16, count, ConvertParquetElementToString(col_meta.codec));

			// encodings, LogicalType::VARCHAR
			vector<string> encoding_string;
			encoding_string.reserve(col_meta.encodings.size());
			for (auto &encoding : col_meta.encodings) {
				encoding_string.push_back(ConvertParquetElementToString(encoding));
			}
			current_chunk.SetValue(17, count, Value(StringUtil::Join(encoding_string, ", ")));

			// index_page_offset, LogicalType::BIGINT
			current_chunk.SetValue(
			    18, count, ParquetElementBigint(col_meta.index_page_offset, col_meta.__isset.index_page_offset));

			// dictionary_page_offset, LogicalType::BIGINT
			current_chunk.SetValue(
			    19, count,
			    ParquetElementBigint(col_meta.dictionary_page_offset, col_meta.__isset.dictionary_page_offset));

			// data_page_offset, LogicalType::BIGINT
			current_chunk.SetValue(20, count, Value::BIGINT(col_meta.data_page_offset));

			// total_compressed_size, LogicalType::BIGINT
			current_chunk.SetValue(21, count, Value::BIGINT(col_meta.total_compressed_size));

			// total_uncompressed_size, LogicalType::BIGINT
			current_chunk.SetValue(22, count, Value::BIGINT(col_meta.total_uncompressed_size));

			// key_value_metadata, LogicalType::MAP(LogicalType::BLOB, LogicalType::BLOB)
			vector<Value> map_keys, map_values;
			for (auto &entry : col_meta.key_value_metadata) {
				map_keys.push_back(Value::BLOB_RAW(entry.key));
				map_values.push_back(Value::BLOB_RAW(entry.value));
			}
			current_chunk.SetValue(
			    23, count,
			    Value::MAP(LogicalType::BLOB, LogicalType::BLOB, std::move(map_keys), std::move(map_values)));

			// bloom_filter_offset, LogicalType::BIGINT
			current_chunk.SetValue(
			    24, count, ParquetElementBigint(col_meta.bloom_filter_offset, col_meta.__isset.bloom_filter_offset));

			// bloom_filter_length, LogicalType::BIGINT
			current_chunk.SetValue(
			    25, count, ParquetElementBigint(col_meta.bloom_filter_length, col_meta.__isset.bloom_filter_length));

			// min_is_exact, LogicalType::BOOLEAN
			current_chunk.SetValue(26, count,
			                       ParquetElementBoolean(stats.is_min_value_exact, stats.__isset.is_min_value_exact));

			// max_is_exact, LogicalType::BOOLEAN
			current_chunk.SetValue(27, count,
			                       ParquetElementBoolean(stats.is_max_value_exact, stats.__isset.is_max_value_exact));

			count++;
			if (count >= STANDARD_VECTOR_SIZE) {
				current_chunk.SetCardinality(count);
				collection.Append(current_chunk);

				count = 0;
				current_chunk.Reset();
			}
		}
	}
	current_chunk.SetCardinality(count);
	collection.Append(current_chunk);

	collection.InitializeScan(scan_state);
}